

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack6_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined1 auVar8 [32];
  
  uVar1 = *(ulong *)in;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar4,0x54);
  auVar4 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar4,_DAT_001a1e00);
  auVar4 = vpinsrd_avx(auVar2,(uint)(uVar1 >> 6) & 0x3ffffff,1);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar5);
  auVar6._8_4_ = 0x3f;
  auVar6._0_8_ = 0x3f0000003f;
  auVar6._12_4_ = 0x3f;
  auVar9._16_4_ = 0x3f;
  auVar9._0_16_ = auVar6;
  auVar9._20_4_ = 0x3f;
  auVar9._24_4_ = 0x3f;
  auVar9._28_4_ = 0x3f;
  auVar4 = vpand_avx(auVar4,auVar6);
  *(undefined1 (*) [16])out = auVar4;
  out[4] = (uint)uVar1 >> 0x18 & 0x3f;
  auVar5 = vpsrlvd_avx2(auVar2,_DAT_001a1e10);
  uVar3 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar6,uVar3 * 4 & 0x3c,0);
  auVar2 = vpor_avx(auVar5,auVar4);
  auVar4 = vpand_avx(auVar5,auVar6);
  auVar4 = vpblendd_avx2(auVar4,auVar2,1);
  *(undefined1 (*) [16])(out + 5) = auVar4;
  out[9] = uVar3 >> 0x16 & 0x3f;
  uVar1 = *(ulong *)(in + 2);
  out[10] = uVar3 >> 0x1c;
  out[10] = uVar3 >> 0x1c | ((uint)uVar1 & 3) << 4;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a1e20);
  auVar5 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar5,_DAT_001a1e30);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar8._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar4;
  auVar8._16_16_ = ZEXT116(1) * auVar7;
  uVar11 = auVar2._0_8_;
  auVar10._8_8_ = uVar11;
  auVar10._0_8_ = uVar11;
  auVar10._16_8_ = uVar11;
  auVar10._24_8_ = uVar11;
  auVar10 = vpblendd_avx2(auVar8,auVar10,0xc0);
  auVar10 = vpand_avx2(auVar10,auVar9);
  auVar9 = vpsrld_avx2(auVar8,0x1a);
  auVar10 = vpblendd_avx2(auVar10,auVar9,0x10);
  *(undefined1 (*) [32])(out + 0xb) = auVar10;
  auVar4 = vpsrlvd_avx2(auVar5,_DAT_001a1e40);
  auVar4 = vpand_avx(auVar4,auVar6);
  *(long *)(out + 0x13) = auVar4._0_8_;
  uVar3 = (uint)(uVar1 >> 0x20);
  out[0x15] = uVar3 >> 0x1e;
  out[0x15] = uVar3 >> 0x1e | (in[4] & 0xf) << 2;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a6320);
  auVar4 = vpand_avx(auVar4,auVar6);
  *(long *)(out + 0x16) = auVar4._0_8_;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack6_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;

  return in + 1;
}